

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamEuler::ComputeGeometricStiffnessMatrix(ChElementBeamEuler *this)

{
  ChMatrixDynamic<> *expr;
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  element_type *peVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  bool bVar22;
  double *pdVar23;
  ulong uVar24;
  double *pdVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  double *pdVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 extraout_var [56];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ChMatrixDynamic<> CKtemp;
  ChMatrix33<double> Rotsect;
  assign_op<double,_double> local_179;
  DenseStorage<double,__1,__1,__1,_1> local_178;
  double local_160;
  double local_158;
  double local_150;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_148;
  ChMatrix33<double> local_100;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  ChMatrixRef local_88;
  ChMatrixRef local_58;
  
  peVar15 = (this->section).
            super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar15 == (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x139,"void chrono::fea::ChElementBeamEuler::ComputeGeometricStiffnessMatrix()");
  }
  lVar16 = (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
  if ((1 < lVar16) &&
     (lVar17 = (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
               .m_cols, 1 < lVar17)) {
    dVar2 = (this->super_ChElementBeam).length;
    auVar31._0_8_ = 6.0 / (dVar2 * 5.0);
    auVar31._8_8_ = 0x4018000000000000;
    auVar33 = ZEXT1664(auVar31);
    expr = &this->Kg;
    pdVar23 = (expr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
              m_data;
    pdVar23[lVar17 + 1] = auVar31._0_8_;
    if ((5 < lVar17) && (pdVar23[lVar17 + 5] = 0.1, 7 < lVar17)) {
      auVar30._8_8_ = 0x8000000000000000;
      auVar30._0_8_ = 0x8000000000000000;
      auVar30 = vxorpd_avx512vl(auVar31,auVar30);
      pdVar23[lVar17 + 7] = auVar30._0_8_;
      if ((0xb < lVar17) && (pdVar23[lVar17 + 0xb] = 0.1, lVar16 != 2)) {
        pdVar23[lVar17 * 2 + 2] = auVar31._0_8_;
        pdVar23[lVar17 * 2 + 4] = -0.1;
        pdVar23[lVar17 * 2 + 8] = auVar30._0_8_;
        pdVar23[lVar17 * 2 + 10] = -0.1;
        if (4 < lVar16) {
          dVar46 = (dVar2 + dVar2) / 15.0;
          pdVar23[lVar17 * 4 + 4] = dVar46;
          pdVar23[lVar17 * 4 + 8] = 0.1;
          pdVar23[lVar17 * 4 + 10] = dVar2 / -30.0;
          if (lVar16 != 5) {
            pdVar23[lVar17 * 5 + 5] = dVar46;
            pdVar23[lVar17 * 5 + 7] = -0.1;
            pdVar23[lVar17 * 5 + 0xb] = dVar2 / -30.0;
            if (7 < lVar16) {
              pdVar23[lVar17 * 7 + 7] = auVar31._0_8_;
              pdVar23[lVar17 * 7 + 0xb] = -0.1;
              if (lVar16 != 8) {
                pdVar23[lVar17 * 8 + 8] = auVar31._0_8_;
                pdVar23[lVar17 * 8 + 10] = 0.1;
                if ((10 < lVar16) && (pdVar23[lVar17 * 10 + 10] = dVar46, lVar16 != 0xb)) {
                  pdVar23[lVar17 * 0xb + 0xb] = dVar46;
                  pdVar25 = pdVar23 + lVar17;
                  pdVar23 = pdVar23 + 1;
                  lVar26 = 1;
                  lVar27 = 0;
                  do {
                    if (lVar27 != 0xb) {
                      if (lVar16 <= lVar27) goto LAB_0067185c;
                      lVar28 = 0;
                      pdVar29 = pdVar25;
                      do {
                        if ((lVar17 <= lVar26 + lVar28) || (lVar16 <= lVar26 + lVar28))
                        goto LAB_0067185c;
                        auVar33 = ZEXT864((ulong)pdVar23[lVar28]);
                        *pdVar29 = pdVar23[lVar28];
                        pdVar29 = pdVar29 + lVar17;
                        lVar1 = lVar27 + 1 + lVar28;
                        lVar28 = lVar28 + 1;
                      } while (lVar1 != 0xb);
                    }
                    auVar31 = auVar33._0_16_;
                    lVar27 = lVar27 + 1;
                    lVar26 = lVar26 + 1;
                    pdVar23 = pdVar23 + lVar17 + 1;
                    pdVar25 = pdVar25 + lVar17 + 1;
                  } while (lVar27 != 0xc);
                  (*(peVar15->super_ChBeamSection)._vptr_ChBeamSection[7])();
                  local_a8 = auVar31;
                  (*(((this->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_ChBeamSection)._vptr_ChBeamSection[8])();
                  local_158 = auVar31._0_8_;
                  (*(((this->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_ChBeamSection)._vptr_ChBeamSection[9])();
                  local_150 = auVar31._0_8_;
                  (*(((this->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_ChBeamSection)._vptr_ChBeamSection[10])();
                  local_98 = auVar31;
                  (*(((this->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_ChBeamSection)._vptr_ChBeamSection[6])();
                  if ((auVar31._0_8_ != 0.0) || (NAN(auVar31._0_8_))) {
                    (*(((this->section).
                        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_ChBeamSection)._vptr_ChBeamSection[6])();
                    auVar19._8_8_ = 0x8000000000000000;
                    auVar19._0_8_ = 0x8000000000000000;
                    local_b8 = vxorpd_avx512vl(auVar31,auVar19);
                    local_160 = cos(local_b8._0_8_);
                    auVar33._0_8_ = sin((double)local_b8._0_8_);
                    auVar33._8_56_ = extraout_var;
                    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[0] = 1.0;
                    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[1] = 0.0;
                    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2] = -0.0;
                    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[6] = auVar33._0_8_ * 0.0;
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = local_160;
                    dVar2 = local_160 * 0.0;
                    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[3] = local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[6] - dVar2;
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ =
                         local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[6];
                    auVar31 = vfmadd213sd_fma(ZEXT816(0),auVar34,auVar49);
                    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4] = auVar31._0_8_;
                    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[6] = dVar2 + local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                       m_storage.m_data.array[6];
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = dVar2;
                    auVar31 = vfmsub213sd_fma(auVar47,ZEXT816(0) << 0x40,auVar33._0_16_);
                    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[7] = auVar31._0_8_;
                    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[8] = local_160;
                    local_178.m_cols = 0;
                    local_178.m_data = (double *)0x0;
                    local_178.m_rows = 0;
                    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[5] = auVar33._0_8_;
                    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_178,0x90,0xc,0xc);
                    local_148.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_data = (PointerType)local_178.m_rows;
                    local_148.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_rows.m_value = local_178.m_cols;
                    local_148.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_cols.m_value = 0;
                    if ((local_178.m_cols | local_178.m_rows) < 0) {
                      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                                   );
                    }
                    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                              ((Matrix<double,__1,__1,_1,__1,__1> *)&local_178,
                               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                *)&local_148,&local_179);
                    local_148.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_data = (PointerType)0x0;
                    local_148.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_rows.m_value = 0;
                    local_148.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_cols.m_value = 0;
                    local_148.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .m_stride.m_outer.m_value = 0;
                    local_148.m_object.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_data = (double *)0x0;
                    local_148.m_object.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_rows = 0;
                    local_148.m_object.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_cols = 0;
                    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
                    construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>
                                *)&local_148,expr);
                    local_88.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .m_stride.m_outer.m_value = 0;
                    local_88.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_data = local_178.m_data;
                    local_88.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_rows.m_value = local_178.m_rows;
                    local_88.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_cols.m_value = local_178.m_cols;
                    if ((local_178.m_rows | local_178.m_cols) < 0 &&
                        local_178.m_data != (double *)0x0) {
                      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                                    "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                                   );
                    }
                    local_88.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .m_stride.m_outer.m_value = local_178.m_cols;
                    ChMatrixCorotation::ComputeCK(&local_148,&local_100,4,&local_88);
                    if (local_148.m_object.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_data != (double *)0x0) {
                      free((void *)local_148.m_object.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                   m_storage.m_data[-1]);
                    }
                    local_148.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_data = (PointerType)0x0;
                    local_148.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_rows.m_value = 0;
                    local_148.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_cols.m_value = 0;
                    local_148.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .m_stride.m_outer.m_value = 0;
                    local_148.m_object.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_data = (double *)0x0;
                    local_148.m_object.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_rows = 0;
                    local_148.m_object.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_cols = 0;
                    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
                    construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>
                                *)&local_148,&local_178);
                    local_58.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_data = (PointerType)0x0;
                    local_58.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_rows.m_value = 0;
                    local_58.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_cols.m_value = 0;
                    local_58.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .m_stride.m_outer.m_value = 0;
                    bVar22 = Eigen::
                             RefBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>
                             ::construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                                       ((RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                                         *)&local_58,expr);
                    if (!bVar22) {
                      __assert_fail("success","/usr/include/eigen3/Eigen/src/Core/Ref.h",0x130,
                                    "Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>::Ref(PlainObjectBase<Derived> &, typename internal::enable_if<bool(Traits::template match<Derived>::MatchAtCompileTime), Derived>::type *) [PlainObjectType = Eigen::Matrix<double, -1, -1, 1>, Options = 0, StrideType = Eigen::OuterStride<>, Derived = Eigen::Matrix<double, -1, -1, 1>]"
                                   );
                    }
                    ChMatrixCorotation::ComputeKCt(&local_148,&local_100,4,&local_58);
                    if (local_148.m_object.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_data != (double *)0x0) {
                      free((void *)local_148.m_object.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                   m_storage.m_data[-1]);
                    }
                    if (local_178.m_data != (double *)0x0) {
                      free((void *)local_178.m_data[-1]);
                    }
                  }
                  auVar48._8_8_ = 0;
                  auVar48._0_8_ = local_158;
                  if ((((local_a8._0_8_ != 0.0) || (NAN(local_a8._0_8_))) || (local_158 != 0.0)) ||
                     (NAN(local_158))) {
                    lVar16 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_rows;
                    if (lVar16 < 1) goto LAB_0067185c;
                    pdVar23 = (this->Kg).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data;
                    uVar18 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    uVar24 = 0;
                    do {
                      if (((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 < 5))
                      goto LAB_0067185c;
                      auVar32._8_8_ = 0;
                      auVar32._0_8_ = pdVar23[uVar24];
                      auVar3._8_8_ = 0;
                      auVar3._0_8_ = pdVar23[uVar18 * 4 + uVar24];
                      auVar31 = vfmadd213sd_fma(auVar32,auVar48,auVar3);
                      pdVar23[uVar18 * 4 + uVar24] = auVar31._0_8_;
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != 0xc);
                    lVar16 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_rows;
                    if (lVar16 < 1) goto LAB_0067185c;
                    auVar20._8_8_ = 0x8000000000000000;
                    auVar20._0_8_ = 0x8000000000000000;
                    auVar31 = vxorpd_avx512vl(local_a8,auVar20);
                    uVar18 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    pdVar23 = (this->Kg).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data;
                    uVar24 = 0;
                    do {
                      if (((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 < 6))
                      goto LAB_0067185c;
                      auVar35._8_8_ = 0;
                      auVar35._0_8_ = pdVar23[uVar24];
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = pdVar23[uVar18 * 5 + uVar24];
                      auVar30 = vfmadd213sd_fma(auVar35,auVar31,auVar4);
                      pdVar23[uVar18 * 5 + uVar24] = auVar30._0_8_;
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != 0xc);
                    lVar16 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_rows;
                    if (lVar16 < 7) goto LAB_0067185c;
                    pdVar23 = (this->Kg).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data;
                    uVar18 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    uVar24 = 0;
                    do {
                      if (((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 < 0xb))
                      goto LAB_0067185c;
                      auVar36._8_8_ = 0;
                      auVar36._0_8_ = pdVar23[uVar18 * 6 + uVar24];
                      auVar5._8_8_ = 0;
                      auVar5._0_8_ = pdVar23[uVar18 * 10 + uVar24];
                      auVar30 = vfmadd213sd_fma(auVar36,auVar48,auVar5);
                      pdVar23[uVar18 * 10 + uVar24] = auVar30._0_8_;
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != 0xc);
                    lVar16 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_rows;
                    if (lVar16 < 7) goto LAB_0067185c;
                    pdVar23 = (this->Kg).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data;
                    uVar18 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    uVar24 = 0;
                    do {
                      if (((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 < 0xc))
                      goto LAB_0067185c;
                      auVar37._8_8_ = 0;
                      auVar37._0_8_ = pdVar23[uVar18 * 6 + uVar24];
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = pdVar23[uVar18 * 0xb + uVar24];
                      auVar30 = vfmadd213sd_fma(auVar37,auVar31,auVar6);
                      pdVar23[uVar18 * 0xb + uVar24] = auVar30._0_8_;
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != 0xc);
                    lVar16 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_rows;
                    lVar17 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    pdVar23 = (this->Kg).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data + 4;
                    lVar26 = 0;
                    do {
                      if (((lVar16 <= lVar26) || (lVar17 < 1)) || (lVar17 < 5)) goto LAB_0067185c;
                      auVar38._8_8_ = 0;
                      auVar38._0_8_ = pdVar23[-4];
                      auVar7._8_8_ = 0;
                      auVar7._0_8_ = *pdVar23;
                      auVar30 = vfmadd213sd_fma(auVar38,auVar48,auVar7);
                      *pdVar23 = auVar30._0_8_;
                      lVar26 = lVar26 + 1;
                      pdVar23 = pdVar23 + lVar17;
                    } while (lVar26 != 0xc);
                    lVar16 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_rows;
                    lVar17 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    pdVar23 = (this->Kg).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data + 5;
                    lVar26 = 0;
                    do {
                      if (((lVar16 <= lVar26) || (lVar17 < 1)) || (lVar17 < 6)) goto LAB_0067185c;
                      auVar39._8_8_ = 0;
                      auVar39._0_8_ = pdVar23[-5];
                      auVar8._8_8_ = 0;
                      auVar8._0_8_ = *pdVar23;
                      auVar30 = vfmadd213sd_fma(auVar39,auVar31,auVar8);
                      *pdVar23 = auVar30._0_8_;
                      lVar26 = lVar26 + 1;
                      pdVar23 = pdVar23 + lVar17;
                    } while (lVar26 != 0xc);
                    lVar16 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_rows;
                    lVar17 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    pdVar23 = (this->Kg).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data + 10;
                    lVar26 = 0;
                    do {
                      if (((lVar16 <= lVar26) || (lVar17 < 7)) || (lVar17 < 0xb)) goto LAB_0067185c;
                      auVar40._8_8_ = 0;
                      auVar40._0_8_ = pdVar23[-4];
                      auVar9._8_8_ = 0;
                      auVar9._0_8_ = *pdVar23;
                      auVar30 = vfmadd213sd_fma(auVar40,auVar48,auVar9);
                      *pdVar23 = auVar30._0_8_;
                      lVar26 = lVar26 + 1;
                      pdVar23 = pdVar23 + lVar17;
                    } while (lVar26 != 0xc);
                    lVar16 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_rows;
                    lVar17 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    pdVar23 = (this->Kg).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data + 0xb;
                    lVar26 = 0;
                    do {
                      if (((lVar16 <= lVar26) || (lVar17 < 7)) || (lVar17 < 0xc)) goto LAB_0067185c;
                      auVar41._8_8_ = 0;
                      auVar41._0_8_ = pdVar23[-5];
                      auVar10._8_8_ = 0;
                      auVar10._0_8_ = *pdVar23;
                      auVar30 = vfmadd213sd_fma(auVar41,auVar31,auVar10);
                      *pdVar23 = auVar30._0_8_;
                      lVar26 = lVar26 + 1;
                      pdVar23 = pdVar23 + lVar17;
                    } while (lVar26 != 0xc);
                  }
                  if (((local_150 == 0.0) && (!NAN(local_150))) &&
                     ((local_98._0_8_ == 0.0 && (!NAN(local_98._0_8_))))) {
                    return;
                  }
                  lVar16 = (this->Kg).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
                  if (1 < lVar16) {
                    pdVar23 = (this->Kg).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data;
                    uVar18 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    auVar21._8_8_ = 0x8000000000000000;
                    auVar21._0_8_ = 0x8000000000000000;
                    auVar31 = vxorpd_avx512vl(local_98,auVar21);
                    uVar24 = 0;
                    do {
                      if ((((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 == 2)) ||
                         (lVar16 < 4)) goto LAB_0067185c;
                      auVar11._8_8_ = 0;
                      auVar11._0_8_ = pdVar23[uVar18 + uVar24];
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ = local_150 * pdVar23[uVar18 * 2 + uVar24];
                      auVar30 = vfmadd231sd_fma(auVar42,auVar31,auVar11);
                      pdVar23[uVar18 * 3 + uVar24] = auVar30._0_8_ + pdVar23[uVar18 * 3 + uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != 0xc);
                    lVar16 = (this->Kg).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_rows;
                    if (7 < lVar16) {
                      pdVar23 = (this->Kg).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                m_storage.m_data;
                      uVar18 = (this->Kg).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_cols;
                      uVar24 = 0;
                      do {
                        if ((((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 == 8)) ||
                           (lVar16 < 10)) goto LAB_0067185c;
                        auVar12._8_8_ = 0;
                        auVar12._0_8_ = pdVar23[uVar18 * 7 + uVar24];
                        auVar43._8_8_ = 0;
                        auVar43._0_8_ = local_150 * pdVar23[uVar18 * 8 + uVar24];
                        auVar30 = vfmadd231sd_fma(auVar43,auVar31,auVar12);
                        pdVar23[uVar18 * 9 + uVar24] = auVar30._0_8_ + pdVar23[uVar18 * 9 + uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar24 != 0xc);
                      lVar16 = (this->Kg).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_rows;
                      lVar17 = (this->Kg).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_cols;
                      pdVar23 = (this->Kg).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                m_storage.m_data + 3;
                      lVar26 = 0;
                      do {
                        if (((lVar16 <= lVar26) || (lVar17 < 2)) || ((lVar17 == 2 || (lVar17 < 4))))
                        goto LAB_0067185c;
                        auVar13._8_8_ = 0;
                        auVar13._0_8_ = pdVar23[-2];
                        auVar44._8_8_ = 0;
                        auVar44._0_8_ = local_150 * pdVar23[-1];
                        auVar30 = vfmadd231sd_fma(auVar44,auVar31,auVar13);
                        *pdVar23 = auVar30._0_8_ + *pdVar23;
                        lVar26 = lVar26 + 1;
                        pdVar23 = pdVar23 + lVar17;
                      } while (lVar26 != 0xc);
                      lVar16 = (this->Kg).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_rows;
                      lVar17 = (this->Kg).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_cols;
                      pdVar23 = (this->Kg).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                m_storage.m_data + 9;
                      lVar26 = 0;
                      while (((lVar26 < lVar16 && (7 < lVar17)) && ((lVar17 != 8 && (9 < lVar17)))))
                      {
                        auVar14._8_8_ = 0;
                        auVar14._0_8_ = pdVar23[-2];
                        auVar45._8_8_ = 0;
                        auVar45._0_8_ = local_150 * pdVar23[-1];
                        auVar30 = vfmadd231sd_fma(auVar45,auVar31,auVar14);
                        *pdVar23 = auVar30._0_8_ + *pdVar23;
                        lVar26 = lVar26 + 1;
                        pdVar23 = pdVar23 + lVar17;
                        if (lVar26 == 0xc) {
                          return;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0067185c:
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementBeamEuler::ComputeGeometricStiffnessMatrix() {
    assert(section);
    
    // Compute the local geometric stiffness matrix Kg without the P multiplication term, that is Kg*(1/P), 
    // so that it is a constant matrix for performance reasons.
    // We used the analytical values from 
    //   [1] "Nonlinear finite element analysis of elastic frames", Kuo Mo, Hsiao Fang, Yu Hou
    //        Computers & Structures Volume 26, Issue 4, 1987, Pages 693-701
    // For the Reddy or timoshenko more detailed case with higher order terms, look also to:
    //   [2] "A Unified Approach to the Timoshenko Geometric Stiffness Matrix Considering Higher-Order Terms in the Strain Tensor"
    //        https://www.scielo.br/pdf/lajss/v16n4/1679-7825-lajss-16-04-e185.pdf
    // Look also at: https://enercalc.com/3d_help/toc161394033.html or in Plesha, Malkus, Cook �Concepts and Applications of Finite Element Analysis? 
    // or in W. McGuire & R.H. Gallagher & R.D. Ziemian, �Matrix Structural Analysis?
      
    //double EA = this->section->GetAxialRigidity();
    //double EIyy = this->section->GetYbendingRigidity();
    //double EIzz = this->section->GetZbendingRigidity();

    double L = this->length;

    double P6_5L_y  = 6. / (5.*L); // optional [2]: ...+ 12*IzA /(L*L*L);
    double P6_5L_z  = 6. / (5.*L); // optional [2]: ...+ 12*IyA /(L*L*L);
    double P_10_y   = 1. / (10.);  // optional [2]: ...+ 6*IzA /(L*L);
    double P_10_z   = 1. / (10.);  // optional [2]: ...+ 6*IyA /(L*L);
    double PL2_15_y = 2.*L / (15.);// optional [2]: ...+ 4*IzA /(L);
    double PL2_15_z = 2.*L / (15.);// optional [2]: ...+ 4*IyA /(L);
    double PL_30_y  = L / (30.);   // optional [2]: ...+ 2*IyA /(L);
    double PL_30_z  = L / (30.);   // optional [2]: ...+ 2*IyA /(L);
   /* 
    this->Kg(0, 0) =   1./L;
    this->Kg(6, 6) =   1./L;
    this->Kg(0, 6) = - 1./L;
    */
    
    this->Kg(1, 1) =  P6_5L_y;
    this->Kg(1, 5) =  P_10_y;
    this->Kg(1, 7) = -P6_5L_y;
    this->Kg(1,11) =  P_10_y;

    this->Kg(2, 2) =  P6_5L_z;
    this->Kg(2, 4) = -P_10_z;
    this->Kg(2, 8) = -P6_5L_z;
    this->Kg(2,10) = -P_10_z;

    this->Kg(4, 4) =  PL2_15_y;
    this->Kg(4, 8) =  P_10_y;
    this->Kg(4,10) = -PL_30_y;

    this->Kg(5, 5) =  PL2_15_z;
    this->Kg(5, 7) = -P_10_z;
    this->Kg(5,11) = -PL_30_z;

    this->Kg(7, 7) =  P6_5L_y;
    this->Kg(7,11) = -P_10_y;

    this->Kg(8, 8) =  P6_5L_z;
    this->Kg(8,10) =  P_10_y;

    this->Kg(10, 10) = PL2_15_y;

    this->Kg(11, 11) = PL2_15_z;

    // symmetric part;
    for (int r = 0; r < 12; r++)
        for (int c = r + 1; c < 12; c++)
            Kg(c, r) = Kg(r, c);



    double Cy = this->section->GetCentroidY();
    double Cz = this->section->GetCentroidZ();
    double Sy = this->section->GetShearCenterY();
    double Sz = this->section->GetShearCenterZ();

    // In case the section is rotated:
    if (this->section->GetSectionRotation()) {
        // Do [K]^ = [R][K][R]'
        ChMatrix33<> Rotsect;
        Rotsect.Set_A_Rxyz(ChVector<>(-section->GetSectionRotation(), 0, 0));
        ChMatrixDynamic<> CKtemp(12, 12);
        CKtemp.setZero();
        ChMatrixCorotation::ComputeCK(this->Kg, Rotsect, 4, CKtemp);
        ChMatrixCorotation::ComputeKCt(CKtemp, Rotsect, 4, this->Kg);
    }
    // In case the section has a centroid displacement:

    if (Cy || Cz) {
        // Do [K]" = [T_c][K]^[T_c]'

        for (int i = 0; i < 12; ++i)
            this->Kg(4, i) += Cz * this->Kg(0, i);
        for (int i = 0; i < 12; ++i)
            this->Kg(5, i) += -Cy * this->Kg(0, i);

        for (int i = 0; i < 12; ++i)
            this->Kg(10, i) += Cz * this->Kg(6, i);
        for (int i = 0; i < 12; ++i)
            this->Kg(11, i) += -Cy * this->Kg(6, i);

        for (int i = 0; i < 12; ++i)
            this->Kg(i, 4) += Cz * this->Kg(i, 0);
        for (int i = 0; i < 12; ++i)
            this->Kg(i, 5) += -Cy * this->Kg(i, 0);

        for (int i = 0; i < 12; ++i)
            this->Kg(i, 10) += Cz * this->Kg(i, 6);
        for (int i = 0; i < 12; ++i)
            this->Kg(i, 11) += -Cy * this->Kg(i, 6);
    }

    // In case the section has a shear center displacement:
    if (Sy || Sz) {
        // Do [K]?= [T_s][K]"[T_s]'

        for (int i = 0; i < 12; ++i)
            this->Kg(3, i) +=
                - Sz * this->Kg(1, i) + Sy * this->Kg(2, i);
        for (int i = 0; i < 12; ++i)
            this->Kg(9, i) +=
                - Sz * this->Kg(7, i) + Sy * this->Kg(8, i);

        for (int i = 0; i < 12; ++i)
            this->Kg(i, 3) +=
                - Sz * this->Kg(i, 1) + Sy * this->Kg(i, 2);
        for (int i = 0; i < 12; ++i)
            this->Kg(i, 9) +=
                - Sz * this->Kg(i, 7) + Sy * this->Kg(i, 8);
    }
}